

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O0

void __thiscall
ASCFile::ASCFile(ASCFile *this,vector<char,_std::allocator<char>_> *buf,path *filepath)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  error_code *in_RDX;
  allocator<char> *in_RDI;
  char *saved_locale;
  path directory;
  error_code ec;
  ASCFile *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  byte bVar4;
  undefined1 in_stack_fffffffffffffe7f;
  error_code *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined5 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb5;
  byte bVar5;
  undefined1 in_stack_fffffffffffffeb6;
  byte bVar6;
  allocator<char> in_stack_fffffffffffffeb7;
  offset_in_ASCFile_to_subr in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec8;
  path *in_stack_fffffffffffffed0;
  ASCFile *in_stack_fffffffffffffed8;
  code *this_00;
  allocator<char> local_111;
  string local_110 [32];
  code *local_f0;
  undefined8 local_e8;
  allocator<char> local_d9;
  string local_d8 [32];
  char *local_b8;
  undefined4 local_84;
  string local_80 [48];
  path local_50;
  error_code local_28;
  error_code *local_18;
  
  local_18 = in_RDX;
  BRDFileBase::BRDFileBase
            ((BRDFileBase *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,
                               CONCAT15(in_stack_fffffffffffffeb5,in_stack_fffffffffffffeb0))));
  *(undefined ***)in_RDI = &PTR__ASCFile_00302e50;
  in_RDI[0xc0] = (allocator<char>)0x1;
  in_RDI[0xc1] = (allocator<char>)0x1;
  in_RDI[0xc2] = (allocator<char>)0x1;
  __s = &local_28;
  std::error_code::error_code((error_code *)in_stack_fffffffffffffe60);
  std::filesystem::weakly_canonical(&local_50,local_18);
  bVar2 = std::error_code::operator_cast_to_bool(&local_28);
  if (bVar2) {
    std::error_code::message_abi_cxx11_
              ((error_code *)
               CONCAT17(in_stack_fffffffffffffe7f,
                        CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)));
    std::__cxx11::string::operator=((string *)(in_RDI + 0x98),local_80);
    std::__cxx11::string::~string(local_80);
    local_84 = 1;
  }
  else {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::__cxx11::path::operator=
              ((path *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
               (path *)in_stack_fffffffffffffe60);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffe60);
    local_b8 = setlocale(1,"C");
    std::allocator<char>::allocator();
    bVar1 = false;
    bVar2 = false;
    bVar6 = 0;
    bVar5 = 0;
    std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffea0,(char *)__s,in_RDI)
    ;
    local_f0 = parse_format;
    local_e8 = 0;
    bVar3 = load_and_parse(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                           in_stack_fffffffffffffec8,in_stack_fffffffffffffeb8);
    bVar4 = 1;
    if (bVar3) {
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffea0,(char *)__s,in_RDI);
      bVar2 = true;
      this_00 = parse_pin;
      bVar3 = load_and_parse((ASCFile *)parse_pin,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffeb8);
      bVar4 = 1;
      if (bVar3) {
        in_stack_fffffffffffffe60 = (ASCFile *)&stack0xfffffffffffffeb7;
        std::allocator<char>::allocator();
        bVar6 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffea0,(char *)__s,in_RDI);
        bVar5 = 1;
        bVar3 = load_and_parse((ASCFile *)this_00,in_stack_fffffffffffffed0,
                               in_stack_fffffffffffffec8,in_stack_fffffffffffffeb8);
        bVar4 = bVar3 ^ 0xff;
      }
    }
    if ((bVar5 & 1) != 0) {
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
    }
    if ((bVar6 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
    }
    if (bVar2) {
      std::__cxx11::string::~string(local_110);
    }
    if (bVar1) {
      std::allocator<char>::~allocator(&local_111);
    }
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    if ((bVar4 & 1) == 0) {
      in_RDI[0x90] = (allocator<char>)0x1;
    }
    else {
      in_RDI[0x90] = (allocator<char>)0x0;
    }
    update_counts(in_stack_fffffffffffffe60);
    setlocale(1,local_b8);
    local_84 = 0;
  }
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffe60);
  return;
}

Assistant:

ASCFile::ASCFile(std::vector<char> &buf, const filesystem::path &filepath) {
	std::error_code ec;
	auto directory = filesystem::weakly_canonical(filepath, ec);
	if (ec) {
		error_msg = ec.message();
		return;
	}
	directory = directory.parent_path();

	char *saved_locale = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	if (!load_and_parse(directory, "format.asc", &ASCFile::parse_format)
		|| !load_and_parse(directory, "pins.asc", &ASCFile::parse_pin)
		|| !load_and_parse(directory, "nails.asc", &ASCFile::parse_nail)) {
		valid = false;
	} else {
		valid = true;
	}

	update_counts();
	setlocale(LC_NUMERIC, saved_locale); // Restore locale
}